

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  undefined8 *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int *piVar23;
  double **ppdVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  double *pdVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  int k_1;
  long lVar37;
  ulong uVar38;
  int iVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  
  if (0 < partitionCount) {
    uVar38 = 0;
    do {
      piVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
      iVar19 = piVar23[partitionIndices[uVar38]];
      iVar20 = piVar23[(long)partitionIndices[uVar38] + 1];
      iVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).kStateCount;
      memset((this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp + iVar21 * iVar19,0,
             (long)((iVar20 - iVar19) * iVar21) << 3);
      ppdVar24 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials;
      pdVar25 = ppdVar24[parentBufferIndices[uVar38]];
      pdVar31 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights
                [categoryWeightsIndices[uVar38]];
      iVar21 = childBufferIndices[uVar38];
      pdVar26 = (this->super_BeagleCPUImpl<double,_1,_0>).gTransitionMatrices
                [probabilityIndices[uVar38]];
      if ((iVar21 < (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount) &&
         (piVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).gTipStates[iVar21],
         piVar23 != (int *)0x0)) {
        lVar36 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
        if (0 < lVar36) {
          iVar33 = iVar19 * 4;
          lVar30 = 0;
          iVar39 = 0;
          iVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
          pdVar27 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
          iVar35 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
          iVar34 = iVar33;
          do {
            if (iVar19 < iVar20) {
              lVar37 = 0;
              auVar48._8_8_ = 0;
              auVar48._0_8_ = pdVar31[lVar30];
              lVar32 = (long)iVar20 - (long)iVar19;
              do {
                iVar22 = *(int *)((long)piVar23 + lVar37 + (long)iVar19 * 4);
                auVar10._8_8_ = 0;
                auVar10._0_8_ = pdVar27[iVar33 + lVar37];
                auVar52._8_8_ = 0;
                auVar52._0_8_ = pdVar26[iVar22 + iVar39] * pdVar25[iVar34 + lVar37];
                auVar49 = vfmadd213sd_fma(auVar52,auVar48,auVar10);
                pdVar27[iVar33 + lVar37] = auVar49._0_8_;
                auVar11._8_8_ = 0;
                auVar11._0_8_ = pdVar27[(long)iVar33 + lVar37 + 1];
                auVar53._8_8_ = 0;
                auVar53._0_8_ = pdVar26[iVar39 + 5 + iVar22] * pdVar25[(long)iVar34 + lVar37 + 1];
                auVar49 = vfmadd213sd_fma(auVar53,auVar48,auVar11);
                pdVar27[(long)iVar33 + lVar37 + 1] = auVar49._0_8_;
                auVar12._8_8_ = 0;
                auVar12._0_8_ = pdVar27[(long)iVar33 + lVar37 + 2];
                auVar54._8_8_ = 0;
                auVar54._0_8_ = pdVar26[iVar39 + 10 + iVar22] * pdVar25[(long)iVar34 + lVar37 + 2];
                auVar49 = vfmadd213sd_fma(auVar54,auVar48,auVar12);
                pdVar27[(long)iVar33 + lVar37 + 2] = auVar49._0_8_;
                auVar13._8_8_ = 0;
                auVar13._0_8_ = pdVar27[(long)iVar33 + lVar37 + 3];
                auVar55._8_8_ = 0;
                auVar55._0_8_ = pdVar26[iVar22 + iVar39 + 0xf] * pdVar25[(long)iVar34 + lVar37 + 3];
                auVar49 = vfmadd213sd_fma(auVar55,auVar48,auVar13);
                pdVar27[(long)iVar33 + lVar37 + 3] = auVar49._0_8_;
                lVar37 = lVar37 + 4;
                lVar32 = lVar32 + -1;
              } while (lVar32 != 0);
              iVar34 = iVar34 + (int)lVar37;
            }
            iVar34 = iVar34 + ((iVar19 - iVar20) + iVar21 + iVar35) * 4;
            iVar39 = iVar39 + 0x14;
            lVar30 = lVar30 + 1;
          } while (lVar30 != lVar36);
        }
      }
      else {
        lVar36 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
        if (0 < lVar36) {
          iVar34 = iVar19 * 4;
          pdVar27 = ppdVar24[iVar21];
          lVar32 = 0;
          lVar30 = 0;
          iVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
          pdVar28 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
          iVar35 = iVar34;
          do {
            if (iVar19 < iVar20) {
              lVar37 = (long)iVar35;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = pdVar26[lVar30];
              auVar61._8_8_ = 0;
              auVar61._0_8_ = pdVar26[lVar30 + 1];
              auVar62._8_8_ = 0;
              auVar62._0_8_ = pdVar26[lVar30 + 2];
              auVar63._8_8_ = 0;
              auVar63._0_8_ = pdVar26[lVar30 + 3];
              auVar64._8_8_ = 0;
              auVar64._0_8_ = pdVar26[lVar30 + 5];
              auVar65._8_8_ = 0;
              auVar65._0_8_ = pdVar26[lVar30 + 6];
              auVar66._8_8_ = 0;
              auVar66._0_8_ = pdVar26[lVar30 + 7];
              auVar67._8_8_ = 0;
              auVar67._0_8_ = pdVar26[lVar30 + 8];
              auVar68._8_8_ = 0;
              auVar68._0_8_ = pdVar26[lVar30 + 10];
              auVar69._8_8_ = 0;
              auVar69._0_8_ = pdVar26[lVar30 + 0xb];
              auVar70._8_8_ = 0;
              auVar70._0_8_ = pdVar26[lVar30 + 0xc];
              auVar71._8_8_ = 0;
              auVar71._0_8_ = pdVar26[lVar30 + 0xd];
              auVar72._8_8_ = 0;
              auVar72._0_8_ = pdVar26[lVar30 + 0xf];
              auVar73._8_8_ = 0;
              auVar73._0_8_ = pdVar26[lVar30 + 0x10];
              auVar74._8_8_ = 0;
              auVar74._0_8_ = pdVar26[lVar30 + 0x11];
              dVar6 = pdVar26[lVar30 + 0x12];
              auVar49._8_8_ = 0;
              auVar49._0_8_ = pdVar31[lVar32];
              lVar29 = 0x18;
              iVar33 = iVar20 - iVar19;
              do {
                uVar2 = *(ulong *)((long)pdVar27 + lVar29 + lVar37 * 8 + -0x10);
                uVar3 = *(ulong *)((long)pdVar27 + lVar29 + lVar37 * 8 + -0x18);
                uVar4 = *(ulong *)((long)pdVar27 + lVar29 + lVar37 * 8 + -8);
                uVar5 = *(ulong *)((long)pdVar27 + lVar29 + lVar37 * 8);
                auVar78._8_8_ = 0;
                auVar78._0_8_ = uVar2;
                auVar40 = vmulsd_avx512f(auVar61,auVar78);
                auVar41 = vmulsd_avx512f(auVar65,auVar78);
                auVar79._8_8_ = 0;
                auVar79._0_8_ = uVar2;
                auVar42 = vmulsd_avx512f(auVar69,auVar79);
                auVar43 = vmulsd_avx512f(auVar73,auVar79);
                auVar76._8_8_ = 0;
                auVar76._0_8_ = uVar3;
                auVar40 = vfmadd231sd_avx512f(auVar40,auVar56,auVar76);
                auVar41 = vfmadd231sd_avx512f(auVar41,auVar64,auVar76);
                auVar77._8_8_ = 0;
                auVar77._0_8_ = uVar3;
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar68,auVar77);
                auVar43 = vfmadd231sd_avx512f(auVar43,auVar72,auVar77);
                auVar80._8_8_ = 0;
                auVar80._0_8_ = uVar4;
                auVar40 = vfmadd231sd_avx512f(auVar40,auVar62,auVar80);
                auVar41 = vfmadd231sd_avx512f(auVar41,auVar66,auVar80);
                auVar81._8_8_ = 0;
                auVar81._0_8_ = uVar4;
                auVar42 = vfmadd231sd_avx512f(auVar42,auVar70,auVar81);
                auVar43 = vfmadd231sd_avx512f(auVar43,auVar74,auVar81);
                auVar82._8_8_ = 0;
                auVar82._0_8_ = uVar5;
                auVar44 = vfmadd231sd_avx512f(auVar40,auVar63,auVar82);
                auVar40._8_8_ = 0;
                auVar40._0_8_ = *(ulong *)((long)pdVar25 + lVar29 + lVar37 * 8 + -0x18);
                auVar40 = vmulsd_avx512f(auVar44,auVar40);
                auVar44 = vfmadd231sd_avx512f(auVar41,auVar67,auVar82);
                auVar83._8_8_ = 0;
                auVar83._0_8_ = uVar5;
                auVar45 = vfmadd231sd_avx512f(auVar42,auVar71,auVar83);
                auVar75._8_8_ = 0;
                auVar75._0_8_ = dVar6;
                auVar46 = vfmadd231sd_avx512f(auVar43,auVar75,auVar83);
                auVar41._8_8_ = 0;
                auVar41._0_8_ = *(ulong *)((long)pdVar28 + lVar29 + (long)iVar34 * 8 + -0x18);
                auVar40 = vfmadd213sd_avx512f(auVar40,auVar49,auVar41);
                puVar1 = (undefined8 *)((long)pdVar28 + lVar29 + (long)iVar34 * 8 + -0x18);
                vmovsd_avx512f(auVar40);
                *puVar1 = *puVar1;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = *(ulong *)((long)pdVar25 + lVar29 + lVar37 * 8 + -0x10);
                auVar40 = vmulsd_avx512f(auVar44,auVar42);
                auVar43._8_8_ = 0;
                auVar43._0_8_ = *(ulong *)((long)pdVar28 + lVar29 + (long)iVar34 * 8 + -0x10);
                auVar40 = vfmadd213sd_avx512f(auVar40,auVar49,auVar43);
                puVar1 = (undefined8 *)((long)pdVar28 + lVar29 + (long)iVar34 * 8 + -0x10);
                vmovsd_avx512f(auVar40);
                *puVar1 = *puVar1;
                auVar44._8_8_ = 0;
                auVar44._0_8_ = *(ulong *)((long)pdVar25 + lVar29 + lVar37 * 8 + -8);
                auVar40 = vmulsd_avx512f(auVar45,auVar44);
                auVar45._8_8_ = 0;
                auVar45._0_8_ = *(ulong *)((long)pdVar28 + lVar29 + (long)iVar34 * 8 + -8);
                auVar40 = vfmadd213sd_avx512f(auVar40,auVar49,auVar45);
                puVar1 = (undefined8 *)((long)pdVar28 + lVar29 + (long)iVar34 * 8 + -8);
                vmovsd_avx512f(auVar40);
                *puVar1 = *puVar1;
                auVar14._8_8_ = 0;
                auVar14._0_8_ = *(ulong *)((long)pdVar25 + lVar29 + lVar37 * 8);
                auVar40 = vmulsd_avx512f(auVar46,auVar14);
                auVar46._8_8_ = 0;
                auVar46._0_8_ = *(ulong *)((long)pdVar28 + lVar29 + (long)iVar34 * 8);
                auVar40 = vfmadd213sd_avx512f(auVar40,auVar49,auVar46);
                puVar1 = (undefined8 *)((long)pdVar28 + lVar29 + (long)iVar34 * 8);
                vmovsd_avx512f(auVar40);
                *puVar1 = *puVar1;
                lVar29 = lVar29 + 0x20;
                iVar33 = iVar33 + -1;
              } while (iVar33 != 0);
            }
            lVar30 = lVar30 + 0x14;
            lVar32 = lVar32 + 1;
            iVar35 = iVar35 + iVar21 * 4;
          } while (lVar32 != lVar36);
        }
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != (uint)partitionCount);
    if (0 < partitionCount) {
      pdVar25 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      uVar38 = 0;
      do {
        piVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
        iVar19 = piVar23[partitionIndices[uVar38]];
        lVar36 = (long)iVar19;
        iVar20 = piVar23[(long)partitionIndices[uVar38] + 1];
        lVar30 = (long)iVar20;
        if (iVar19 < iVar20) {
          iVar20 = cumulativeScaleIndices[uVar38];
          pdVar31 = (this->super_BeagleCPUImpl<double,_1,_0>).gStateFrequencies
                    [stateFrequenciesIndices[uVar38]];
          dVar6 = pdVar31[1];
          dVar7 = *pdVar31;
          dVar8 = pdVar31[2];
          dVar9 = pdVar31[3];
          pdVar31 = pdVar25 + (long)(iVar19 * 4) + 3;
          lVar32 = lVar36;
          do {
            auVar57._8_8_ = 0;
            auVar57._0_8_ = dVar7;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = pdVar31[-3];
            auVar50._8_8_ = 0;
            auVar50._0_8_ = dVar6 * pdVar31[-2];
            auVar49 = vfmadd231sd_fma(auVar50,auVar57,auVar15);
            auVar58._8_8_ = 0;
            auVar58._0_8_ = dVar8;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = pdVar31[-1];
            auVar49 = vfmadd231sd_fma(auVar49,auVar58,auVar16);
            auVar59._8_8_ = 0;
            auVar59._0_8_ = dVar9;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = *pdVar31;
            auVar49 = vfmadd231sd_fma(auVar49,auVar59,auVar17);
            dVar47 = log(auVar49._0_8_);
            pdVar26 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
            pdVar31 = pdVar31 + 4;
            pdVar26[lVar32] = dVar47;
            lVar32 = lVar32 + 1;
          } while (lVar30 != lVar32);
          if (iVar20 != -1) {
            pdVar31 = (this->super_BeagleCPUImpl<double,_1,_0>).gScaleBuffers[iVar20];
            lVar32 = lVar36;
            do {
              pdVar26[lVar32] = pdVar31[lVar32] + pdVar26[lVar32];
              lVar32 = lVar32 + 1;
            } while (lVar30 != lVar32);
          }
          auVar51 = ZEXT864(0) << 0x40;
          outSumLogLikelihoodByPartition[uVar38] = 0.0;
          pdVar31 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights;
          do {
            auVar60._8_8_ = 0;
            auVar60._0_8_ = pdVar26[lVar36];
            auVar18._8_8_ = 0;
            auVar18._0_8_ = pdVar31[lVar36];
            auVar49 = vfmadd231sd_fma(auVar51._0_16_,auVar60,auVar18);
            auVar51 = ZEXT1664(auVar49);
            lVar36 = lVar36 + 1;
            outSumLogLikelihoodByPartition[uVar38] = auVar49._0_8_;
          } while (lVar30 != lVar36);
        }
        else {
          outSumLogLikelihoodByPartition[uVar38] = 0.0;
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 != (uint)partitionCount);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition(
                                                          const int* parentBufferIndices,
                                                          const int* childBufferIndices,
                                                          const int* probabilityIndices,
                                                          const int* categoryWeightsIndices,
                                                          const int* stateFrequenciesIndices,
                                                          const int* cumulativeScaleIndices,
                                                          const int* partitionIndices,
                                                          int partitionCount,
                                                          double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * 4; // Index for parent partials
            int w = 0;
            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * 4; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];

                    integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                    integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                    integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                    integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                    u += 4;
                    v += 4;
                }
                w += OFFSET*4;
                if (kExtraPatterns)
                  v += 4 * kExtraPatterns;
                v += ((kPatternCount - endPattern) + startPattern) * 4;
            }
        } else { // Integrate against a partial at the child
            const REALTYPE* partialsChild = gPartials[childIndex];
        #if 0//
            int v = 0;
        #endif
            int w = 0;
            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * 4;
          #if 1//
          int v = l*kPaddedPatternCount*4 + startPattern * 4;
          #endif
                const REALTYPE weight = wt[l];

                PREFETCH_MATRIX(1,transMatrix,w);

                for(int k = startPattern; k < endPattern; k++) {

                    const REALTYPE* partials1 = partialsChild;

                    PREFETCH_PARTIALS(1,partials1,v);

                    DO_INTEGRATION(1);

                    integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                    integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                    integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                    integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                    u += 4;
                    v += 4;
                }
                w += OFFSET*4;
          #if 0//
                if (kExtraPatterns)
                  v += 4 * kExtraPatterns;
                v += ((kPatternCount - endPattern) + startPattern) * 4;
          #endif//
            }
        }
    }

    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}